

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

void setDateTime(QDateTimeData *d,QDate date,QTime time)

{
  undefined8 uVar1;
  QDateTimePrivate *pQVar2;
  uint uVar3;
  QTime QVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  QDateTimePrivate *pQVar8;
  bool bVar9;
  
  QVar4.mds = time.mds;
  if ((uint)time.mds >= 86400000) {
    QVar4.mds = 0;
  }
  bVar9 = 0x16d3e147973 < date.jd + 0xb69eeff91fU;
  lVar5 = date.jd + -0x253d8c;
  if (bVar9) {
    lVar5 = 0;
  }
  uVar6 = 6;
  if (bVar9) {
    uVar6 = (uint)((uint)time.mds < 86400000) << 2;
  }
  uVar3 = QVar4.mds + 0xfad9a400;
  if (QVar4.mds == 0U || lVar5 >= 0) {
    uVar3 = QVar4.mds;
  }
  lVar5 = (ulong)(QVar4.mds != 0U && lVar5 < 0) + lVar5;
  bVar9 = SEXT816(lVar5 * 86400000) == SEXT816(lVar5) * SEXT416(86400000);
  lVar7 = lVar5 * 86400000;
  if (bVar9) {
    lVar7 = lVar5 * 86400000 + (long)(int)uVar3;
  }
  if (!bVar9 || SCARRY8(lVar5 * 86400000,(long)(int)uVar3)) {
    uVar6 = 0;
    lVar7 = 0;
  }
  pQVar8 = d->d;
  if (((ulong)pQVar8 & 1) != 0) {
    if (lVar7 + 0x80000000000000U >> 0x38 == 0) {
      pQVar8 = (QDateTimePrivate *)((ulong)((uint)pQVar8 & 0x31 | uVar6) | lVar7 << 8);
    }
    else {
      pQVar8 = (QDateTimePrivate *)operator_new(0x20);
      pQVar8->super_QSharedData = (QAtomicInt)0x0;
      pQVar8->m_status = (QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)0x0;
      pQVar8->m_msecs = 0;
      pQVar8->m_offsetFromUtc = 0;
      QTimeZone::QTimeZone(&pQVar8->m_timeZone);
      pQVar2 = d->d;
      (pQVar8->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = (uint)pQVar2 & 0xfe;
      pQVar8->m_msecs = (long)pQVar2 >> 8;
      (pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 1;
    }
    d->d = pQVar8;
  }
  if (((ulong)pQVar8 & 1) == 0) {
    if ((pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      pQVar2 = (QDateTimePrivate *)operator_new(0x20);
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 0;
      uVar1 = *(undefined8 *)((long)&pQVar8->m_msecs + 4);
      *(undefined8 *)&pQVar2->m_status = *(undefined8 *)&pQVar8->m_status;
      *(undefined8 *)((long)&pQVar2->m_msecs + 4) = uVar1;
      QTimeZone::QTimeZone(&pQVar2->m_timeZone,&pQVar8->m_timeZone);
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 1;
      pQVar8 = d->d;
      LOCK();
      (pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        pQVar8 = d->d;
        if (pQVar8 != (QDateTimePrivate *)0x0) {
          QTimeZone::~QTimeZone(&pQVar8->m_timeZone);
        }
        operator_delete(pQVar8,0x20);
      }
      d->d = pQVar2;
      pQVar8 = pQVar2;
    }
    pQVar8->m_msecs = lVar7;
    (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
         super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 0xffffff31;
    (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
         super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i | uVar6;
  }
  return;
}

Assistant:

static void setDateTime(QDateTimeData &d, QDate date, QTime time)
{
    // If the date is valid and the time is not we set time to 00:00:00
    if (!time.isValid() && date.isValid())
        time = QTime::fromMSecsSinceStartOfDay(0);

    QDateTimePrivate::StatusFlags newStatus = { };

    // Set date value and status
    qint64 days = 0;
    if (date.isValid()) {
        days = date.toJulianDay() - JULIAN_DAY_FOR_EPOCH;
        newStatus = QDateTimePrivate::ValidDate;
    }

    // Set time value and status
    int ds = 0;
    if (time.isValid()) {
        ds = time.msecsSinceStartOfDay();
        newStatus |= QDateTimePrivate::ValidTime;
    }
    Q_ASSERT(ds < MSECS_PER_DAY);
    // Only the later parts of the very first day are representable - its start
    // would overflow - so get ds the same side of 0 as days:
    if (days < 0 && ds > 0) {
        days++;
        ds -= MSECS_PER_DAY;
    }

    // Check in representable range:
    qint64 msecs = 0;
    if (daysAndMillisOverflow(days, qint64(ds), &msecs)) {
        newStatus = QDateTimePrivate::StatusFlags{};
        msecs = 0;
    }
    if (d.isShort()) {
        // let's see if we can keep this short
        if (msecsCanBeSmall(msecs)) {
            // yes, we can
            d.data.msecs = qintptr(msecs);
            d.data.status &= ~(QDateTimePrivate::ValidityMask | QDateTimePrivate::DaylightMask).toInt();
            d.data.status |= newStatus.toInt();
        } else {
            // nope...
            d.detach();
        }
    }
    if (!d.isShort()) {
        d.detach();
        d->m_msecs = msecs;
        d->m_status &= ~(QDateTimePrivate::ValidityMask | QDateTimePrivate::DaylightMask);
        d->m_status |= newStatus;
    }
}